

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  protobuf *this;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  protobuf *ppVar12;
  bool bVar13;
  uint128 n;
  uint128 n_00;
  LogFinisher local_71;
  uint128 *local_70;
  LogMessage local_68;
  uint64 extraout_RDX;
  
  uVar6 = divisor.hi_;
  n.hi_ = (protobuf *)divisor.lo_;
  n.lo_ = dividend.hi_;
  this = (protobuf *)dividend.lo_;
  if (n.hi_ == (protobuf *)0x0 && uVar6 == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/int128.cc",0x56);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"Division or mod by zero: dividend.hi=");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,n.lo_);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,", lo=");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,(unsigned_long)this);
    internal::LogFinisher::operator=(&local_71,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    bVar13 = n.lo_ < uVar6;
    if (n.lo_ == uVar6) {
      bVar13 = this < n.hi_;
    }
    if (bVar13) {
      quotient_ret->lo_ = 0;
      quotient_ret->hi_ = 0;
    }
    else {
      local_70 = quotient_ret;
      iVar2 = Fls128(this,n);
      n_00.hi_ = extraout_RDX;
      n_00.lo_ = uVar6;
      iVar3 = Fls128(n.hi_,n_00);
      if (iVar2 - iVar3 < 0) {
        uVar7 = 0;
        uVar9 = 0;
      }
      else {
        uVar5 = (ulong)(uint)(iVar2 - iVar3);
        lVar8 = 0x40 - uVar5;
        uVar9 = 0;
        uVar10 = 0;
        do {
          bVar1 = (byte)uVar5;
          if ((int)uVar5 < 0x40) {
            uVar11 = uVar6;
            ppVar12 = n.hi_;
            if (uVar5 != 0) {
              uVar11 = (ulong)n.hi_ >> ((byte)lVar8 & 0x3f) | uVar6 << (bVar1 & 0x3f);
              ppVar12 = (protobuf *)((long)n.hi_ << (bVar1 & 0x3f));
            }
          }
          else {
            if ((int)uVar5 < 0x80) {
              uVar11 = (long)n.hi_ << (bVar1 & 0x3f);
            }
            else {
              uVar11 = 0;
            }
            ppVar12 = (protobuf *)0x0;
          }
          uVar7 = uVar10 * 2;
          bVar13 = uVar11 <= n.lo_;
          if (n.lo_ == uVar11) {
            bVar13 = ppVar12 <= this;
          }
          if (bVar13) {
            bVar13 = this < ppVar12;
            this = this + -(long)ppVar12;
            n.lo_ = (n.lo_ - uVar11) - (ulong)bVar13;
            uVar7 = uVar7 | 1;
          }
          uVar9 = uVar9 << 1 | uVar10 >> 0x3f;
          uVar5 = uVar5 - 1;
          lVar8 = lVar8 + 1;
          uVar10 = uVar7;
        } while (0 < (int)uVar5 + 1);
      }
      local_70->lo_ = uVar7;
      local_70->hi_ = uVar9;
    }
    remainder_ret->lo_ = (uint64)this;
    remainder_ret->hi_ = n.lo_;
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  } else if (dividend < divisor) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  } else {
    int dividend_bit_length = Fls128(dividend);
    int divisor_bit_length = Fls128(divisor);
    int difference = dividend_bit_length - divisor_bit_length;
    uint128 quotient = 0;
    while (difference >= 0) {
      quotient <<= 1;
      uint128 shifted_divisor = divisor << difference;
      if (shifted_divisor <= dividend) {
        dividend -= shifted_divisor;
        quotient += 1;
      }
      difference -= 1;
    }
    //record the final quotient and remainder
    *quotient_ret = quotient;
    *remainder_ret = dividend;
  }
}